

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

int xmlListRemoveFirst(xmlListPtr l,void *data)

{
  _xmlLink *p_Var1;
  xmlLinkPtr pxVar2;
  int iVar3;
  
  iVar3 = 0;
  if (l != (xmlListPtr)0x0) {
    pxVar2 = xmlListLinkSearch(l,data);
    iVar3 = 0;
    if (pxVar2 != (xmlLinkPtr)0x0) {
      p_Var1 = pxVar2->prev;
      p_Var1->next = pxVar2->next;
      pxVar2->next->prev = p_Var1;
      if (l->linkDeallocator != (_func_void_xmlLinkPtr *)0x0) {
        (*l->linkDeallocator)(pxVar2);
      }
      (*xmlFree)(pxVar2);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int
xmlListRemoveFirst(xmlListPtr l, void *data)
{
    xmlLinkPtr lk;

    if (l == NULL)
        return(0);
    /*Find the first instance of this data */
    lk = xmlListLinkSearch(l, data);
    if (lk != NULL) {
        xmlLinkDeallocator(l, lk);
        return 1;
    }
    return 0;
}